

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

pid_t absl::lts_20240722::base_internal::GetCachedTID(void)

{
  pid_t *ppVar1;
  
  ppVar1 = (pid_t *)__tls_get_addr(&PTR_00105fb0);
  if ((char)ppVar1[1] == '\0') {
    GetCachedTID();
  }
  return *ppVar1;
}

Assistant:

pid_t GetCachedTID() {
#ifdef ABSL_HAVE_THREAD_LOCAL
  static thread_local pid_t thread_id = GetTID();
  return thread_id;
#else
  return GetTID();
#endif  // ABSL_HAVE_THREAD_LOCAL
}